

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall
inja::SetStatementNode::SetStatementNode(SetStatementNode *this,string *key,size_t pos)

{
  size_t pos_local;
  string *key_local;
  SetStatementNode *this_local;
  
  StatementNode::StatementNode(&this->super_StatementNode,pos);
  (this->super_StatementNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_001c29d0;
  ::std::__cxx11::string::string((string *)&this->key,(string *)key);
  ExpressionListNode::ExpressionListNode(&this->expression);
  return;
}

Assistant:

explicit SetStatementNode(const std::string& key, size_t pos): StatementNode(pos), key(key) {}